

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.h
# Opt level: O2

void * absl::lts_20240722::flags_internal::FlagOps<bool>(FlagOp op,void *v1,void *v2,void *v3)

{
  char cVar1;
  pointer_conflict1 pAVar2;
  bool *p;
  Allocator alloc;
  
  switch(op) {
  case kAlloc:
    pAVar2 = std::allocator_traits<std::allocator<AlignedSpace>_>::allocate(&alloc,1);
    return pAVar2;
  case kDelete:
    operator_delete(v2,4);
    break;
  case kCopy:
  case kCopyConstruct:
    *(undefined1 *)v2 = *v1;
    break;
  case kSizeof:
    return (void *)0x1;
  case kFastTypeId:
    return "";
  case kRuntimeTypeId:
    return &bool::typeinfo;
  case kParse:
    alloc = *v2;
    cVar1 = absl::lts_20240722::flags_internal::AbslParseFlag(*v1,*(undefined8 *)((long)v1 + 8));
    if (cVar1 != '\0') {
      *(Allocator *)v2 = alloc;
      return v2;
    }
    break;
  case kUnparse:
    UnparseFlag<bool>((string *)&alloc,(bool *)v1);
    std::__cxx11::string::operator=((string *)v2,(string *)&alloc);
    std::__cxx11::string::~string((string *)&alloc);
    break;
  case kValueOffset:
    return (void *)0x50;
  }
  return (void *)0x0;
}

Assistant:

void* FlagOps(FlagOp op, const void* v1, void* v2, void* v3) {
  struct AlignedSpace {
    alignas(MaskedPointer::RequiredAlignment()) alignas(T) char buf[sizeof(T)];
  };
  using Allocator = std::allocator<AlignedSpace>;
  switch (op) {
    case FlagOp::kAlloc: {
      Allocator alloc;
      return std::allocator_traits<Allocator>::allocate(alloc, 1);
    }
    case FlagOp::kDelete: {
      T* p = static_cast<T*>(v2);
      p->~T();
      Allocator alloc;
      std::allocator_traits<Allocator>::deallocate(
          alloc, reinterpret_cast<AlignedSpace*>(p), 1);
      return nullptr;
    }
    case FlagOp::kCopy:
      *static_cast<T*>(v2) = *static_cast<const T*>(v1);
      return nullptr;
    case FlagOp::kCopyConstruct:
      new (v2) T(*static_cast<const T*>(v1));
      return nullptr;
    case FlagOp::kSizeof:
      return reinterpret_cast<void*>(static_cast<uintptr_t>(sizeof(T)));
    case FlagOp::kFastTypeId:
      return const_cast<void*>(base_internal::FastTypeId<T>());
    case FlagOp::kRuntimeTypeId:
      return const_cast<std::type_info*>(GenRuntimeTypeId<T>());
    case FlagOp::kParse: {
      // Initialize the temporary instance of type T based on current value in
      // destination (which is going to be flag's default value).
      T temp(*static_cast<T*>(v2));
      if (!absl::ParseFlag<T>(*static_cast<const absl::string_view*>(v1), &temp,
                              static_cast<std::string*>(v3))) {
        return nullptr;
      }
      *static_cast<T*>(v2) = std::move(temp);
      return v2;
    }
    case FlagOp::kUnparse:
      *static_cast<std::string*>(v2) =
          absl::UnparseFlag<T>(*static_cast<const T*>(v1));
      return nullptr;
    case FlagOp::kValueOffset: {
      // Round sizeof(FlagImp) to a multiple of alignof(FlagValue<T>) to get the
      // offset of the data.
      size_t round_to = alignof(FlagValue<T>);
      size_t offset = (sizeof(FlagImpl) + round_to - 1) / round_to * round_to;
      return reinterpret_cast<void*>(offset);
    }
  }
  return nullptr;
}